

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

void __thiscall CTxMemPool::PrioritiseTransaction(CTxMemPool *this,uint256 *hash,CAmount *nFeeDelta)

{
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> *this_00;
  type *this_01;
  indexed_transaction_set *__a;
  size_type *psVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  index_node_type *piVar6;
  bool bVar7;
  mapped_type *pmVar8;
  iterator x;
  CTxMemPool *pCVar9;
  _Base_ptr p_Var10;
  char *pcVar11;
  long lVar12;
  CTxMemPool *this_02;
  CTxMemPool *pCVar13;
  long in_FS_OFFSET;
  string_view calling_fn_name;
  string_view source_file;
  string_view source_file_00;
  pair<std::_Rb_tree_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>,_std::_Rb_tree_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  pVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_long>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_long>_>_>
  pVar15;
  string_view logging_function;
  string_view logging_function_00;
  char *local_d8;
  txiter it;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  string local_b8;
  setEntries setDescendants;
  setEntries ancestors;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock13.super_unique_lock._M_device = &(this->cs).super_recursive_mutex;
  criticalblock13.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock13.super_unique_lock);
  this_00 = &this->mapDeltas;
  pmVar8 = std::
           map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
           ::operator[](this_00,hash);
  lVar4 = *pmVar8;
  lVar5 = *nFeeDelta;
  if (lVar4 < 1) {
    if ((lVar4 != 0) && (lVar12 = -0x8000000000000000, lVar5 < -0x8000000000000000 - lVar4))
    goto LAB_00abbbe5;
  }
  else {
    lVar12 = 0x7fffffffffffffff;
    if (0x7fffffffffffffff - lVar4 < lVar5) goto LAB_00abbbe5;
  }
  lVar12 = lVar5 + lVar4;
LAB_00abbbe5:
  *pmVar8 = lVar12;
  this_01 = &(this->mapTx).super_type;
  x = boost::multi_index::detail::
      hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
      ::find<uint256,SaltedTxidHasher,std::equal_to<uint256>>
                ((hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                  *)this_01,hash,&(this->mapTx).super_type.hash_,
                 &(this->mapTx).super_type.field_0x68);
  it.node = x.node;
  if (x.node != (this->mapTx).
                super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
                .member) {
    __a = &this->mapTx;
    CTxMemPoolEntry::UpdateModifiedFee((CTxMemPoolEntry *)x.node,*nFeeDelta);
    bVar7 = boost::multi_index::detail::
            hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
            ::modify_(this_01,x.node);
    if (!bVar7) {
      std::
      allocator_traits<std::allocator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_>_>
      ::destroy<CTxMemPoolEntry>((allocator_type *)__a,(CTxMemPoolEntry *)x.node);
      operator_delete(x.node,0x178);
      psVar1 = &(this->mapTx).node_count;
      *psVar1 = *psVar1 - 1;
    }
    setDescendants._M_t._M_impl._0_8_ = 0x7fffffffffffffff;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x7fffffff;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x7fffffffffffffff;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)0x7fffffffffffffff;
    this_02 = (CTxMemPool *)&ancestors;
    calling_fn_name._M_str = "PrioritiseTransaction";
    calling_fn_name._M_len = 0x15;
    AssumeCalculateMemPoolAncestors
              ((setEntries *)this_02,this,calling_fn_name,(CTxMemPoolEntry *)it.node,
               (Limits *)&setDescendants,false);
    pCVar13 = (CTxMemPool *)ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (pCVar13 != (CTxMemPool *)&ancestors._M_t._M_impl.super__Rb_tree_header) {
      piVar6 = (index_node_type *)pCVar13->lastRollingFeeUpdate;
      CTxMemPoolEntry::UpdateDescendantState((CTxMemPoolEntry *)piVar6,0,*nFeeDelta,0);
      bVar7 = boost::multi_index::detail::
              hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
              ::modify_(this_01,piVar6);
      if (!bVar7) {
        std::
        allocator_traits<std::allocator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_>_>
        ::destroy<CTxMemPoolEntry>((allocator_type *)__a,(CTxMemPoolEntry *)piVar6);
        operator_delete(piVar6,0x178);
        psVar1 = &(this->mapTx).node_count;
        *psVar1 = *psVar1 - 1;
      }
      pCVar9 = (CTxMemPool *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar13);
      this_02 = pCVar13;
      pCVar13 = pCVar9;
    }
    p_Var2 = &setDescendants._M_t._M_impl.super__Rb_tree_header;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    CalculateDescendants(this_02,it,&setDescendants);
    pVar14 = std::_Rb_tree<$270907ca$>::equal_range(&setDescendants._M_t,&it);
    std::_Rb_tree<$270907ca$>::_M_erase_aux
              (&setDescendants._M_t,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node
              );
    for (p_Var10 = setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != p_Var2;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10)) {
      piVar6 = *(index_node_type **)(p_Var10 + 1);
      CTxMemPoolEntry::UpdateAncestorState((CTxMemPoolEntry *)piVar6,0,*nFeeDelta,0,0);
      bVar7 = boost::multi_index::detail::
              hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
              ::modify_(this_01,piVar6);
      if (!bVar7) {
        std::
        allocator_traits<std::allocator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_>_>
        ::destroy<CTxMemPoolEntry>((allocator_type *)__a,(CTxMemPoolEntry *)piVar6);
        operator_delete(piVar6,0x178);
        psVar1 = &(this->mapTx).node_count;
        *psVar1 = *psVar1 - 1;
      }
    }
    LOCK();
    (this->nTransactionsUpdated).super___atomic_base<unsigned_int>._M_i =
         (this->nTransactionsUpdated).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    std::_Rb_tree<$270907ca$>::~_Rb_tree(&setDescendants._M_t);
    std::_Rb_tree<$270907ca$>::~_Rb_tree(&ancestors._M_t);
  }
  if (*pmVar8 == 0) {
    pVar15 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
             ::equal_range(&this_00->_M_t,hash);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar15.first._M_node,(_Base_ptr)pVar15.second._M_node);
    base_blob<256u>::ToString_abi_cxx11_((string *)&ancestors,hash);
    pcVar11 = "";
    if (it.node ==
        (this->mapTx).
        super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
        .member) {
      pcVar11 = "not ";
    }
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
    ;
    source_file_00._M_len = 0x5d;
    logging_function_00._M_str = "PrioritiseTransaction";
    logging_function_00._M_len = 0x15;
    setDescendants._M_t._M_impl._0_8_ = pcVar11;
    LogPrintFormatInternal<std::__cxx11::string,char_const*>
              (logging_function_00,source_file_00,0x386,ALL,Info,(ConstevalFormatString<2U>)0xfb0227
               ,(string *)&ancestors,(char **)&setDescendants);
  }
  else {
    base_blob<256u>::ToString_abi_cxx11_((string *)&ancestors,hash);
    local_d8 = "";
    if (it.node ==
        (this->mapTx).
        super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
        .member) {
      local_d8 = "not ";
    }
    FormatMoney_abi_cxx11_((string *)&setDescendants,*nFeeDelta);
    FormatMoney_abi_cxx11_(&local_b8,*pmVar8);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
    ;
    source_file._M_len = 0x5d;
    logging_function._M_str = "PrioritiseTransaction";
    logging_function._M_len = 0x15;
    LogPrintFormatInternal<std::__cxx11::string,char_const*,std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0x38c,ALL,Info,(ConstevalFormatString<4U>)0xfb025f,
               (string *)&ancestors,&local_d8,(string *)&setDescendants,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((_Base_ptr *)setDescendants._M_t._M_impl._0_8_ !=
        &setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)setDescendants._M_t._M_impl._0_8_,
                      (ulong)((long)&(setDescendants._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  if ((_Base_ptr *)ancestors._M_t._M_impl._0_8_ !=
      &ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)ancestors._M_t._M_impl._0_8_,
                    (ulong)((long)&(ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                   )->_M_color + 1));
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTxMemPool::PrioritiseTransaction(const uint256& hash, const CAmount& nFeeDelta)
{
    {
        LOCK(cs);
        CAmount &delta = mapDeltas[hash];
        delta = SaturatingAdd(delta, nFeeDelta);
        txiter it = mapTx.find(hash);
        if (it != mapTx.end()) {
            mapTx.modify(it, [&nFeeDelta](CTxMemPoolEntry& e) { e.UpdateModifiedFee(nFeeDelta); });
            // Now update all ancestors' modified fees with descendants
            auto ancestors{AssumeCalculateMemPoolAncestors(__func__, *it, Limits::NoLimits(), /*fSearchForParents=*/false)};
            for (txiter ancestorIt : ancestors) {
                mapTx.modify(ancestorIt, [=](CTxMemPoolEntry& e){ e.UpdateDescendantState(0, nFeeDelta, 0);});
            }
            // Now update all descendants' modified fees with ancestors
            setEntries setDescendants;
            CalculateDescendants(it, setDescendants);
            setDescendants.erase(it);
            for (txiter descendantIt : setDescendants) {
                mapTx.modify(descendantIt, [=](CTxMemPoolEntry& e){ e.UpdateAncestorState(0, nFeeDelta, 0, 0); });
            }
            ++nTransactionsUpdated;
        }
        if (delta == 0) {
            mapDeltas.erase(hash);
            LogPrintf("PrioritiseTransaction: %s (%sin mempool) delta cleared\n", hash.ToString(), it == mapTx.end() ? "not " : "");
        } else {
            LogPrintf("PrioritiseTransaction: %s (%sin mempool) fee += %s, new delta=%s\n",
                      hash.ToString(),
                      it == mapTx.end() ? "not " : "",
                      FormatMoney(nFeeDelta),
                      FormatMoney(delta));
        }
    }
}